

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

__pid_t __thiscall kj::Executor::wait(Executor *this,void *__stat_loc)

{
  State *this_00;
  Mutex *this_01;
  XThreadEvent **ppXVar1;
  RemoveConst<kj::_::XThreadEvent_*> *ppXVar2;
  XThreadEvent **ppXVar3;
  __pid_t extraout_EAX;
  __pid_t _Var4;
  Vector<kj::_::XThreadEvent_*> eventsToCancelOutsideLock;
  Locked<kj::Executor::Impl::State> lock;
  PredicateImpl_conflict1 impl;
  undefined1 local_79;
  Vector<kj::_::XThreadEvent_*> local_78;
  Mutex *local_50;
  State *local_48;
  undefined **local_40;
  undefined1 *local_38;
  State *local_30;
  undefined1 local_28;
  
  local_78.builder.ptr = (XThreadEvent **)0x0;
  local_78.builder.pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
  local_78.builder.endPtr = (XThreadEvent **)0x0;
  local_78.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  this_01 = (Mutex *)(this->impl).ptr;
  local_40 = (undefined **)((ulong)local_40 & 0xffffffffffffff00);
  kj::_::Mutex::lock(this_01,0);
  this_00 = (State *)(this_01 + 1);
  local_40 = &PTR_check_0037f8f8;
  local_38 = &local_79;
  local_28 = 0;
  local_50 = this_01;
  local_48 = this_00;
  local_30 = this_00;
  kj::_::Mutex::wait(this_01,&local_40);
  Impl::State::dispatchAll(this_00,&local_78);
  kj::_::Mutex::unlock(this_01,EXCLUSIVE,(Waiter *)0x0);
  Impl::processAsyncCancellations((this->impl).ptr,&local_78);
  ppXVar3 = local_78.builder.endPtr;
  ppXVar2 = local_78.builder.pos;
  ppXVar1 = local_78.builder.ptr;
  _Var4 = extraout_EAX;
  if (local_78.builder.ptr != (XThreadEvent **)0x0) {
    local_78.builder.ptr = (XThreadEvent **)0x0;
    local_78.builder.pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
    local_78.builder.endPtr = (XThreadEvent **)0x0;
    _Var4 = (*(code *)**(undefined8 **)local_78.builder.disposer)
                      (local_78.builder.disposer,ppXVar1,8,(long)ppXVar2 - (long)ppXVar1 >> 3,
                       (long)ppXVar3 - (long)ppXVar1 >> 3,0);
  }
  return _Var4;
}

Assistant:

void Executor::wait() {
  Vector<_::XThreadEvent*> eventsToCancelOutsideLock;
  KJ_DEFER(impl->processAsyncCancellations(eventsToCancelOutsideLock));

  auto lock = impl->state.lockExclusive();

  lock.wait([](const Impl::State& state) {
    return state.isDispatchNeeded();
  });

  lock->dispatchAll(eventsToCancelOutsideLock);
}